

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

void __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::~runner
          (runner<ApprovalTests::cfg::reporter,_16> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pp_Var3;
  pointer pbVar4;
  pointer pcVar5;
  _func_void **suite;
  pointer pp_Var6;
  
  bVar2 = this->run_;
  if (bVar2 == false) {
    this->run_ = true;
    pp_Var3 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pp_Var6 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                   _M_impl.super__Vector_impl_data._M_start; pp_Var6 != pp_Var3;
        pp_Var6 = pp_Var6 + 1) {
      (**pp_Var6)();
    }
    pp_Var6 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
        super__Vector_impl_data._M_finish != pp_Var6) {
      (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish = pp_Var6;
    }
  }
  if (this->dry_run_ == false) {
    reporter<boost::ext::ut::v1_1_8::printer>::on((reporter<boost::ext::ut::v1_1_8::printer> *)this)
    ;
  }
  if ((bVar2 == false) && (this->fails_ != 0)) {
    exit(-1);
  }
  pbVar4 = (this->tag_).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (pointer)0x0) {
    operator_delete(pbVar4,(long)(this->tag_).
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar4);
  }
  pbVar4 = (this->filter_).path_.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (pointer)0x0) {
    operator_delete(pbVar4,(long)(this->filter_).path_.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar4);
  }
  pp_Var6 = (this->suites_).super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pp_Var6 != (pointer)0x0) {
    operator_delete(pp_Var6,(long)(this->suites_).
                                  super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pp_Var6)
    ;
  }
  pcVar5 = (this->reporter_).currentTest.originalFileName._M_dataplus._M_p;
  paVar1 = &(this->reporter_).currentTest.originalFileName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->reporter_).currentTest.fileName._M_dataplus._M_p;
  paVar1 = &(this->reporter_).currentTest.fileName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->reporter_).currentTest.sections);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &(this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.out_);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.printer_.field_0xb0)
  ;
  return;
}

Assistant:

~runner() {
      const auto should_run = not run_;

      if (should_run) {
        static_cast<void>(run());
      }

      if (not dry_run_) {
        reporter_.on(events::summary{});
      }

      if (should_run and fails_) {
        std::exit(-1);
      }
    }